

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_end(bitstream *str)

{
  int iVar1;
  uint32_t local_1c;
  bitstream *pbStack_18;
  uint32_t one;
  bitstream *str_local;
  
  local_1c = 1;
  pbStack_18 = str;
  if (str->type == VS_H262) {
    str_local._4_4_ = vs_align_byte(str,VS_ALIGN_0);
  }
  else {
    if (str->type != VS_H264) {
      abort();
    }
    iVar1 = vs_u(str,&local_1c,1);
    if (iVar1 == 0) {
      if (local_1c == 1) {
        str_local._4_4_ = vs_align_byte(pbStack_18,VS_ALIGN_0);
      }
      else {
        fprintf(_stderr,"Wrong RBSP trailing bit!\n");
        str_local._4_4_ = 1;
      }
    }
    else {
      str_local._4_4_ = 1;
    }
  }
  return str_local._4_4_;
}

Assistant:

int vs_end(struct bitstream *str) {
	uint32_t one = 1;
	switch (str->type) {
		case VS_H262:
			return vs_align_byte(str, VS_ALIGN_0);
		case VS_H264:
			if (vs_u(str, &one, 1))
				return 1;
			if (one != 1) {
				fprintf (stderr, "Wrong RBSP trailing bit!\n");
				return 1;
			}
			return vs_align_byte(str, VS_ALIGN_0);
			/* XXX: add the cabac special case */
		default:
			abort();
	}
}